

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O0

void __thiscall TGAImage::clear(TGAImage *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  allocator<unsigned_char> local_2a;
  value_type_conflict local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  TGAImage *local_10;
  TGAImage *this_local;
  
  uVar1 = this->width;
  uVar2 = this->height;
  uVar3 = this->bytespp;
  local_29 = '\0';
  local_10 = this;
  std::allocator<unsigned_char>::allocator(&local_2a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_28,(ulong)(uVar1 * uVar2 * uVar3),&local_29,&local_2a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->data,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  std::allocator<unsigned_char>::~allocator(&local_2a);
  return;
}

Assistant:

void TGAImage::clear() { data = std::vector<std::uint8_t>(width * height * bytespp, 0); }